

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O3

bool Cipher::saveFreqMapBinary(char *fname,TFreqMap *freqMap)

{
  int iVar1;
  TProb *pTVar2;
  long lVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  mapped_type_conflict *pmVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  bool bVar13;
  uint8_t n_1;
  uint8_t d;
  vector<int,_std::allocator<int>_> keys;
  int32_t n;
  ofstream fout;
  char local_28a;
  char local_289;
  void *local_288;
  iterator iStack_280;
  int *local_278;
  int local_264;
  _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
  local_260;
  long local_230;
  filebuf local_228 [24];
  int aiStack_210 [54];
  ios_base local_138 [264];
  int iVar12;
  
  std::ofstream::ofstream(&local_230,fname,_S_bin);
  iVar7 = *(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18));
  if (iVar7 == 0) {
    std::ostream::write((char *)&local_230,(long)freqMap);
    std::ostream::write((char *)&local_230,(long)&freqMap->nTotal);
    pTVar2 = &freqMap->pmin;
    std::ostream::write((char *)&local_230,(long)pTVar2);
    local_260._M_impl._0_4_ = *(undefined4 *)&(freqMap->prob)._M_h._M_element_count;
    std::ostream::write((char *)&local_230,(long)&local_260);
    std::map<int,float,std::less<int>,std::allocator<std::pair<int_const,float>>>::
    map<std::__detail::_Node_const_iterator<std::pair<int_const,float>,false,false>>
              ((map<int,float,std::less<int>,std::allocator<std::pair<int_const,float>>> *)
               &local_260,
               (_Node_const_iterator<std::pair<const_int,_float>,_false,_false>)
               (freqMap->prob)._M_h._M_before_begin._M_nxt,
               (_Node_const_iterator<std::pair<const_int,_float>,_false,_false>)0x0);
    local_288 = (void *)0x0;
    iStack_280._M_current = (int *)0x0;
    local_278 = (int *)0x0;
    p_Var4 = &local_260._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_260._M_impl.super__Rb_tree_header._M_header._M_left != p_Var4) {
      p_Var5 = local_260._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((*(float *)&p_Var5[1].field_0x4 != *pTVar2) ||
           (NAN(*(float *)&p_Var5[1].field_0x4) || NAN(*pTVar2))) {
          if (iStack_280._M_current == local_278) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_288,iStack_280,(int *)(p_Var5 + 1))
            ;
          }
          else {
            *iStack_280._M_current = p_Var5[1]._M_color;
            iStack_280._M_current = iStack_280._M_current + 1;
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var4);
    }
    local_264 = iVar7;
    if (0 < (int)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2)) {
      uVar10 = 0;
      do {
        std::ostream::write((char *)&local_230,(long)((long)local_288 + (long)(int)uVar10 * 4));
        pmVar6 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                 ::operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                               *)&local_260,
                              (key_type_conflict *)((long)(int)uVar10 * 4 + (long)local_288));
        std::ostream::write((char *)&local_230,(long)pmVar6);
        iVar7 = (int)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2);
        if (uVar10 == iVar7 - 1U) break;
        iVar1 = uVar10 + 1;
        lVar9 = (long)iVar1;
        lVar8 = 0;
        do {
          iVar12 = (int)lVar8;
          if (0xff < *(int *)((long)local_288 + lVar8 * 4 + lVar9 * 4) -
                     *(int *)((long)local_288 + lVar8 * 4 + lVar9 * 4 + -4)) goto LAB_00126cb6;
          lVar3 = lVar8 + 1;
        } while (((iVar7 - uVar10) + -2 != iVar12) &&
                (bVar13 = (int)(uVar10 + 0xfe) - lVar9 != lVar8, lVar8 = lVar3, bVar13));
        iVar12 = (int)lVar3;
LAB_00126cb6:
        uVar11 = iVar12 + iVar1;
        iVar7 = ~uVar10 + uVar11;
        local_28a = (char)iVar7;
        std::ostream::write((char *)&local_230,(long)&local_28a);
        if ((local_28a != '\0') && (iVar1 < (int)uVar11)) {
          lVar9 = lVar9 << 2;
          do {
            local_289 = (char)*(undefined4 *)((long)local_288 + lVar9) -
                        (char)*(undefined4 *)((long)local_288 + lVar9 + -4);
            std::ostream::write((char *)&local_230,(long)&local_289);
            pmVar6 = std::
                     map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                     ::operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                   *)&local_260,(key_type_conflict *)((long)local_288 + lVar9));
            std::ostream::write((char *)&local_230,(long)pmVar6);
            lVar9 = lVar9 + 4;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        uVar10 = uVar11;
      } while ((int)uVar11 < (int)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2));
    }
    if (local_288 != (void *)0x0) {
      operator_delete(local_288,(long)local_278 - (long)local_288);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
    ::~_Rb_tree(&local_260);
    iVar7 = local_264;
  }
  else {
    printf("    Failed to open file \'%s\'\n",fname);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _SDL_GetNumAudioDevices;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar7 == 0;
}

Assistant:

bool saveFreqMapBinary(const char * fname, const TFreqMap & freqMap) {
        std::ofstream fout(fname, std::ios::binary);
        if (fout.good() == false) {
            printf("    Failed to open file '%s'\n", fname);
            return false;
        }

        fout.write((const char *) &freqMap.len,    sizeof(freqMap.len));
        fout.write((const char *) &freqMap.nTotal, sizeof(freqMap.nTotal));
        fout.write((const char *) &freqMap.pmin,   sizeof(freqMap.pmin));

        { int32_t n = freqMap.prob.size(); fout.write((const char *) &n, sizeof(n)); }

        {
            std::map<TCode, TProb> sorted(freqMap.prob.begin(), freqMap.prob.end());

            std::vector<TCode> keys;
            for (const auto & [i, p] : sorted) {
                if (p == freqMap.pmin) {
                    continue;
                }
                keys.push_back(i);
            }

            int32_t is = 0;
            while (is < (int) keys.size()) {
                fout.write((const char *) &keys[is],         sizeof(keys[is]));
                fout.write((const char *) &sorted[keys[is]], sizeof(sorted[keys[is]]));

                if (is == (int) keys.size() - 1) break;

                int32_t ie = is + 1;
                while (keys[ie] - keys[ie - 1] < 256) {
                    ++ie;
                    if (ie == (int) keys.size()) break;
                    if (ie == is + 255) break;
                }

                uint8_t n = (uint8_t) (ie - is - 1);
                fout.write((const char *) &n, sizeof(n));
                if (n > 0) {
                    for (int i = is + 1; i < ie; ++i) {
                        uint8_t d = (uint8_t) (keys[i] - keys[i - 1]);
                        fout.write((const char *) &d,               sizeof(d));
                        fout.write((const char *) &sorted[keys[i]], sizeof(sorted[keys[i]]));
                    }
                }

                is = ie;
            }
        }

        return true;
    }